

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrappedValue.cpp
# Opt level: O3

QString * __thiscall WrappedValue::toQString(QString *__return_storage_ptr__,WrappedValue *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  uint64_t uVar4;
  storage_type *psVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  bool isOk;
  QVariant val;
  bool local_a9;
  undefined1 local_a8 [32];
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QString local_68;
  QArrayData *local_50 [3];
  anon_union_24_3_e3d07ef4_for_data local_38;
  
  if (this->m_Type == COMPLEX) {
    psVar5 = (storage_type *)0x3;
  }
  else {
    if (this->m_Type != NONE) {
      getQVariant((QVariant *)&local_38,this);
      if (this->m_Type - STRING < 2) {
        QVariant::toString();
      }
      else if (this->m_Type == INT) {
        if (this->m_Size < 9) {
          local_a9 = false;
          uVar4 = AbstractByteBuffer::getNumValue
                            (this->m_Owner,this->m_Offset,this->m_Size,&local_a9);
          if (local_a9 != false) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            (**this->_vptr_WrappedValue)(local_50,this);
            QString::toUtf8_helper(&local_68);
            if (local_68.d.ptr == (char16_t *)0x0) {
              local_68.d.ptr = (char16_t *)&QByteArray::_empty;
            }
            local_a8._0_8_ = (PrivateShared *)(local_a8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,local_68.d.ptr,local_68.d.size + (long)local_68.d.ptr);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,8);
              }
            }
            QString::asprintf((char *)&local_88,local_a8._0_8_,uVar4);
            pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
            pcVar2 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).d = (Data *)local_88;
            (__return_storage_ptr__->d).ptr = pcStack_80;
            qVar3 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_78;
            local_88 = pQVar1;
            pcStack_80 = pcVar2;
            local_78 = qVar3;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,2,8);
              }
            }
            if ((PrivateShared *)local_a8._0_8_ != (PrivateShared *)(local_a8 + 0x10)) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,8);
              }
            }
            goto LAB_00120449;
          }
          QVar8.m_data = (storage_type *)0x7;
          QVar8.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar8);
        }
        else {
          QVar7.m_data = (storage_type *)0x3;
          QVar7.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar7);
        }
        (__return_storage_ptr__->d).d = (Data *)local_a8._0_8_;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_a8._8_8_;
        (__return_storage_ptr__->d).size = local_a8._16_8_;
      }
      else {
        getQVariant((QVariant *)local_a8,this);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)local_a8);
      }
LAB_00120449:
      QVariant::~QVariant((QVariant *)&local_38);
      return __return_storage_ptr__;
    }
    psVar5 = (storage_type *)0x0;
  }
  QVar6.m_size = &local_38;
  QVar6.m_data = psVar5;
  QString::fromUtf8(QVar6);
  (__return_storage_ptr__->d).d = (Data *)local_38.shared;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_38._8_8_;
  (__return_storage_ptr__->d).size = local_38._16_8_;
  return __return_storage_ptr__;
}

Assistant:

QString WrappedValue::toQString()
{
    if (this->m_Type == NONE) return "";
    if (this->m_Type == COMPLEX) return "...";

    QVariant val = getQVariant();

    if (this->m_Type == STRING || this->m_Type == WSTRING) {
        return val.toString();
    }
    if (this->m_Type == INT) {

        bufsize_t size = this->m_Size;
        if (size > sizeof(uint64_t)) return  "...";

        bool isOk = false;
        uint64_t num = m_Owner->getNumValue(m_Offset, m_Size, &isOk);
        if (!isOk) return "INVALID";
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf(getIntFormat().toStdString().c_str(), num);
#else
        out.sprintf(getIntFormat().toStdString().c_str(), num);
#endif
        return out;
    }
    return getQVariant().toString();
}